

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,char_type *value)

{
  byte bVar1;
  undefined4 uVar2;
  format_specs *pfVar3;
  undefined3 uVar4;
  void *in_RDX;
  basic_format_specs<char> local_28;
  
  pfVar3 = this->specs_;
  bVar1 = pfVar3->type_;
  if (bVar1 != 0x73) {
    if (bVar1 == 0x70) {
      local_28.super_align_spec.width_ = (pfVar3->super_align_spec).width_;
      local_28.super_align_spec.fill_ = (pfVar3->super_align_spec).fill_;
      uVar2 = pfVar3->precision_;
      uVar4 = *(undefined3 *)&pfVar3->field_0x15;
      local_28.super_align_spec.align_ =
           (alignment)*(undefined8 *)&(pfVar3->super_align_spec).align_;
      local_28.flags_ = 8;
      local_28.type_ = 'x';
      local_28.precision_ = uVar2;
      local_28._21_3_ = uVar4;
      basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
      write_int<unsigned_long,fmt::v5::basic_format_specs<char>>
                ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
                 this,(unsigned_long)value,&local_28);
      goto LAB_00116a90;
    }
    if (bVar1 != 0) {
      error_handler::on_error((error_handler *)this,"invalid type specifier");
    }
  }
  write(this,(int)value,in_RDX,(ulong)bVar1);
LAB_00116a90:
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const char_type *value) {
    internal::handle_cstring_type_spec(
          specs_.type_, cstring_spec_handler(*this, value));
    return out();
  }